

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

void fast_dual_interp_filter_rd
               (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
               BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_y,RD_STATS *rd_stats,
               int *switchable_rate,BUFFER_SET **dst_bufs,int *switchable_ctx,int skip_hor,
               int skip_ver)

{
  long lVar1;
  int_interpfilters iVar2;
  int iVar3;
  int64_t iVar4;
  undefined1 in_CL;
  int *in_RDX;
  BUFFER_SET *unaff_RBX;
  BUFFER_SET **in_RSI;
  int64_t *in_RDI;
  RD_STATS *in_R8;
  undefined8 unaff_R12;
  int_interpfilters *unaff_R13;
  int_interpfilters *unaff_R14;
  MACROBLOCK *unaff_R15;
  RD_STATS *in_stack_00000010;
  RD_STATS *in_stack_00000018;
  int *in_stack_00000020;
  BUFFER_SET **in_stack_00000028;
  int in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  int in_stack_00000040;
  int i_1;
  int i;
  int skip_pred;
  int best_dual_mode;
  int bh;
  int bw;
  int_interpfilters lf;
  int_interpfilters af;
  INTERP_PRED_TYPE pred_filter_type;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  InterpSearchFlags *interp_search_flags;
  int_interpfilters *in_stack_ffffffffffffff50;
  int_interpfilters *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  INTERP_PRED_TYPE local_71;
  undefined7 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)in_RDI[0x40b];
  local_71 = '\0';
  iVar2 = av1_broadcast_interp_filter(INTERP_INVALID);
  iVar3 = have_newmv_in_inter_mode(*(PREDICTION_MODE *)(lVar1 + 2));
  if (iVar3 == 0) {
    local_71 = is_pred_filter_search_allowed
                         ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (MACROBLOCKD *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (BLOCK_SIZE)((uint)in_stack_ffffffffffffff64 >> 0x18),
                          in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  if (local_71 == '\0') {
    iVar3 = 0;
    for (iVar5 = 2; 0 < iVar5; iVar5 = iVar5 + -1) {
      iVar4 = interpolation_filter_rd
                        (unaff_R15,(AV1_COMP *)&unaff_R14->as_filters,
                         (TileDataEnc *)&unaff_R13->as_filters,
                         (BLOCK_SIZE)((ulong)unaff_R12 >> 0x38),unaff_RBX,in_RDI,in_stack_00000010,
                         in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                         (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000040);
      if (iVar4 != 0) {
        iVar3 = iVar5;
      }
    }
    for (iVar5 = iVar3 + 6; iVar3 + 3 <= iVar5; iVar5 = iVar5 + -3) {
      interpolation_filter_rd
                (unaff_R15,(AV1_COMP *)&unaff_R14->as_filters,(TileDataEnc *)&unaff_R13->as_filters,
                 (BLOCK_SIZE)((ulong)unaff_R12 >> 0x38),unaff_RBX,in_RDI,in_stack_00000010,
                 in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                 (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000040);
    }
  }
  else {
    pred_dual_interp_filter_rd
              ((MACROBLOCK *)CONCAT44(iVar2.as_int,in_stack_ffffffffffffff80),
               (AV1_COMP *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (TileDataEnc *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (BLOCK_SIZE)((uint)in_stack_ffffffffffffff6c >> 0x18),
               (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int64_t *)&stack0xffffffffffffff84,in_R8,
               (RD_STATS *)CONCAT17(in_CL,in_stack_ffffffffffffffb8),in_RDX,in_RSI,(int *)in_RDI,
               (int)unaff_RBX,(INTERP_PRED_TYPE)unaff_R12,unaff_R13,unaff_R14);
  }
  return;
}

Assistant:

static inline void fast_dual_interp_filter_rd(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], const int switchable_ctx[2],
    const int skip_hor, const int skip_ver) {
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  INTERP_PRED_TYPE pred_filter_type = INTERP_HORZ_NEQ_VERT_NEQ;
  int_interpfilters af = av1_broadcast_interp_filter(INTERP_INVALID);
  int_interpfilters lf = af;

  if (!have_newmv_in_inter_mode(mbmi->mode)) {
    pred_filter_type = is_pred_filter_search_allowed(cpi, xd, bsize, &af, &lf);
  }

  if (pred_filter_type) {
    pred_dual_interp_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                               rd_stats_y, rd_stats, switchable_rate, dst_bufs,
                               switchable_ctx, (skip_hor & skip_ver),
                               pred_filter_type, &af, &lf);
  } else {
    const int bw = block_size_wide[bsize];
    const int bh = block_size_high[bsize];
    int best_dual_mode = 0;
    int skip_pred =
        bw <= 4 ? interp_search_flags->default_interp_skip_flags : skip_hor;
    // TODO(any): Make use of find_best_interp_rd_facade()
    // if speed impact is negligible
    for (int i = (SWITCHABLE_FILTERS - 1); i >= 1; --i) {
      if (interpolation_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                  rd_stats_y, rd_stats, switchable_rate,
                                  dst_bufs, i, switchable_ctx, skip_pred)) {
        best_dual_mode = i;
      }
      skip_pred = skip_hor;
    }
    // From best of horizontal EIGHTTAP_REGULAR modes, check vertical modes
    skip_pred =
        bh <= 4 ? interp_search_flags->default_interp_skip_flags : skip_ver;
    for (int i = (best_dual_mode + (SWITCHABLE_FILTERS * 2));
         i >= (best_dual_mode + SWITCHABLE_FILTERS); i -= SWITCHABLE_FILTERS) {
      interpolation_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                              rd_stats_y, rd_stats, switchable_rate, dst_bufs,
                              i, switchable_ctx, skip_pred);
      skip_pred = skip_ver;
    }
  }
}